

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5WriteDlidxGrow(Fts5Index *p,Fts5SegWriter *pWriter,int nLvl)

{
  Fts5DlidxWriter *pFVar1;
  size_t nByte;
  Fts5DlidxWriter *aDlidx;
  int nLvl_local;
  Fts5SegWriter *pWriter_local;
  Fts5Index *p_local;
  
  if ((p->rc == 0) && (pWriter->nDlidx <= nLvl)) {
    pFVar1 = (Fts5DlidxWriter *)sqlite3_realloc64(pWriter->aDlidx,(long)nLvl << 5);
    if (pFVar1 == (Fts5DlidxWriter *)0x0) {
      p->rc = 7;
    }
    else {
      memset(pFVar1 + pWriter->nDlidx,0,(long)(nLvl - pWriter->nDlidx) << 5);
      pWriter->aDlidx = pFVar1;
      pWriter->nDlidx = nLvl;
    }
  }
  return p->rc;
}

Assistant:

static int fts5WriteDlidxGrow(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  int nLvl
){
  if( p->rc==SQLITE_OK && nLvl>=pWriter->nDlidx ){
    Fts5DlidxWriter *aDlidx = (Fts5DlidxWriter*)sqlite3_realloc64(
        pWriter->aDlidx, sizeof(Fts5DlidxWriter) * nLvl
    );
    if( aDlidx==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      size_t nByte = sizeof(Fts5DlidxWriter) * (nLvl - pWriter->nDlidx);
      memset(&aDlidx[pWriter->nDlidx], 0, nByte);
      pWriter->aDlidx = aDlidx;
      pWriter->nDlidx = nLvl;
    }
  }
  return p->rc;
}